

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_state_user_resp(connectdata *conn,int pop3code,pop3state instate)

{
  char *pcVar1;
  CURLcode CVar2;
  char *pcVar3;
  
  if (pop3code == 0x2b) {
    pcVar1 = ((conn->data->state).proto.http)->postdata;
    pcVar3 = "";
    if (pcVar1 != (char *)0x0) {
      pcVar3 = pcVar1;
    }
    CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"PASS %s",pcVar3);
  }
  else {
    Curl_failf(conn->data,"Access denied. %c",(ulong)(uint)pop3code);
    CVar2 = CURLE_LOGIN_DENIED;
  }
  if (CVar2 == CURLE_OK) {
    (conn->proto).ftpc.count2 = 0xf;
  }
  return CVar2;
}

Assistant:

static CURLcode pop3_state_user_resp(struct connectdata *conn,
                                     int pop3code,
                                     pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct FTP *pop3 = data->state.proto.pop3;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Access denied. %c", pop3code);
    result = CURLE_LOGIN_DENIED;
  }
  else
    /* Send the PASS command */
    result = Curl_pp_sendf(&conn->proto.pop3c.pp, "PASS %s",
                           pop3->passwd ? pop3->passwd : "");
  if(result)
    return result;

  state(conn, POP3_PASS);

  return result;
}